

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::AddBuiltinCommand(cmState *this,string *name,cmCommand *command)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>
  local_50;
  
  cmsys::SystemTools::LowerCase(&local_50.first,name);
  __n = name->_M_string_length;
  if (__n == local_50.first._M_string_length) {
    if (__n != 0) {
      iVar3 = bcmp((name->_M_dataplus)._M_p,local_50.first._M_dataplus._M_p,__n);
      if (iVar3 != 0) goto LAB_001e7a33;
    }
    paVar1 = &local_50.first.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p,
                      local_50.first.field_2._M_allocated_capacity + 1);
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
            ::find(&(this->BuiltinCommands)._M_t,name);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &(this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header) {
      pcVar2 = (name->_M_dataplus)._M_p;
      local_50.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
      local_50.second = command;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCommand*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                  *)&this->BuiltinCommands,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_50.first._M_dataplus._M_p,
                        local_50.first.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    __assert_fail("this->BuiltinCommands.find(name) == this->BuiltinCommands.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x1ab,"void cmState::AddBuiltinCommand(const std::string &, cmCommand *)");
  }
LAB_001e7a33:
  __assert_fail("name == cmSystemTools::LowerCase(name)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,0x1aa,"void cmState::AddBuiltinCommand(const std::string &, cmCommand *)");
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name, cmCommand* command)
{
  assert(name == cmSystemTools::LowerCase(name));
  assert(this->BuiltinCommands.find(name) == this->BuiltinCommands.end());
  this->BuiltinCommands.insert(std::make_pair(name, command));
}